

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

string * __thiscall
banksia::ChessBoard::getFen_abi_cxx11_
          (string *__return_storage_ptr__,ChessBoard *this,int halfCount,int fullMoveCount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  string *psVar3;
  uint uVar4;
  ostream *this_00;
  int pos;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ostringstream stringStream;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar7 = 0;
  paVar1 = &local_1d0.field_2;
  iVar5 = 0;
  do {
    pPVar2 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_BoardCore).pieces.
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) <= uVar7) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
    }
    if (pPVar2[uVar7].type == empty) {
      iVar5 = iVar5 + 1;
      if ((~(uint)uVar7 & 7) == 0) {
        if (iVar5 != 0) {
          std::ostream::operator<<(local_1a8,iVar5);
        }
        if (uVar7 != 0x3f) goto LAB_0017d097;
        break;
      }
    }
    else {
      if (iVar5 != 0) {
        std::ostream::operator<<(local_1a8,iVar5);
      }
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (uVar7 != 0x3f && (~(uint)uVar7 & 7) == 0) {
LAB_0017d097:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/",1);
      }
      iVar5 = 0;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x40);
  pcVar6 = " b ";
  if ((this->super_BoardCore).side == white) {
    pcVar6 = " w ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,3);
  psVar3 = local_1b0;
  uVar4 = (uint)this->castleRights[1];
  if ((int)this->castleRights[0] + uVar4 == 0) {
    pcVar6 = "-";
  }
  else {
    if ((this->CastleRight_short & uVar4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"K",1);
      uVar4 = (uint)this->castleRights[1];
    }
    if ((this->CastleRight_long & uVar4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Q",1);
    }
    uVar4 = (uint)this->castleRights[0];
    if ((this->CastleRight_short & uVar4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"k",1);
      uVar4 = (uint)this->castleRights[0];
    }
    if ((this->CastleRight_long & uVar4) == 0) goto LAB_0017d199;
    pcVar6 = "q";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,1);
LAB_0017d199:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  if (this->enpassant < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
  }
  else {
    posToCoordinateString_abi_cxx11_(&local_1d0,(banksia *)(ulong)(uint)this->enpassant,pos);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  this_00 = (ostream *)std::ostream::operator<<(local_1a8,halfCount);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  std::ostream::operator<<(this_00,fullMoveCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ChessBoard::getFen(int halfCount, int fullMoveCount) const {
    std::ostringstream stringStream;
    
    int e = 0;
    for (int i=0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            e += 1;
        } else {
            if (e) {
                stringStream << e;
                e = 0;
            }
            stringStream << piece.toString();
        }
        
        if (i % 8 == 7) {
            if (e) {
                stringStream << e;
            }
            if (i < 63) {
                stringStream << "/";
            }
            e = 0;
        }
    }
    
    stringStream << (side == Side::white ? " w " : " b ");
    
    if (castleRights[W] + castleRights[B]) {
        if (castleRights[W] & CastleRight_short) {
            stringStream << "K";
        }
        if (castleRights[W] & CastleRight_long) {
            stringStream << "Q";
        }
        if (castleRights[B] & CastleRight_short) {
            stringStream << "k";
        }
        if (castleRights[B] & CastleRight_long) {
            stringStream << "q";
        }
    } else {
        stringStream << "-";
    }
    
    stringStream << " ";
    if (enpassant > 0) {
        stringStream << posToCoordinateString(enpassant);
    } else {
        stringStream << "-";
    }
    
    stringStream << " " << halfCount << " " << fullMoveCount;
    
    return stringStream.str();
}